

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void color_cmyk_to_rgb(opj_image_t *image)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  uint local_40;
  uint i;
  uint max;
  uint h;
  uint w;
  float sK;
  float sY;
  float sM;
  float sC;
  float K;
  float Y;
  float M;
  float C;
  opj_image_t *image_local;
  
  OVar1 = image->comps->w;
  OVar2 = image->comps->h;
  if ((((image->numcomps < 4) || (image->comps->dx != image->comps[1].dx)) ||
      (image->comps->dx != image->comps[2].dx)) ||
     (((image->comps->dx != image->comps[3].dx || (image->comps->dy != image->comps[1].dy)) ||
      ((image->comps->dy != image->comps[2].dy || (image->comps->dy != image->comps[3].dy)))))) {
    fprintf(_stderr,"%s:%d:color_cmyk_to_rgb\n\tCAN NOT CONVERT\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/bin/common/color.c"
            ,0x3f7);
  }
  else {
    OVar3 = image->comps->prec;
    OVar4 = image->comps[1].prec;
    OVar5 = image->comps[2].prec;
    OVar6 = image->comps[3].prec;
    for (local_40 = 0; local_40 < OVar1 * OVar2; local_40 = local_40 + 1) {
      iVar7 = image->comps[1].data[local_40];
      iVar8 = image->comps[2].data[local_40];
      fVar9 = 1.0 - (float)image->comps[3].data[local_40] *
                    (1.0 / (float)((1 << ((byte)OVar6 & 0x1f)) + -1));
      image->comps->data[local_40] =
           (int)((1.0 - (float)image->comps->data[local_40] *
                        (1.0 / (float)((1 << ((byte)OVar3 & 0x1f)) + -1))) * 255.0 * fVar9);
      image->comps[1].data[local_40] =
           (int)((1.0 - (float)iVar7 * (1.0 / (float)((1 << ((byte)OVar4 & 0x1f)) + -1))) * 255.0 *
                fVar9);
      image->comps[2].data[local_40] =
           (int)((1.0 - (float)iVar8 * (1.0 / (float)((1 << ((byte)OVar5 & 0x1f)) + -1))) * 255.0 *
                fVar9);
    }
    opj_image_data_free(image->comps[3].data);
    image->comps[3].data = (OPJ_INT32 *)0x0;
    image->comps->prec = 8;
    image->comps[1].prec = 8;
    image->comps[2].prec = 8;
    image->numcomps = image->numcomps - 1;
    image->color_space = OPJ_CLRSPC_SRGB;
    for (local_40 = 3; local_40 < image->numcomps; local_40 = local_40 + 1) {
      memcpy(image->comps + local_40,image->comps + (local_40 + 1),0x40);
    }
  }
  return;
}

Assistant:

void color_cmyk_to_rgb(opj_image_t *image)
{
    float C, M, Y, K;
    float sC, sM, sY, sK;
    unsigned int w, h, max, i;

    w = image->comps[0].w;
    h = image->comps[0].h;

    if (
        (image->numcomps < 4)
        || (image->comps[0].dx != image->comps[1].dx) ||
        (image->comps[0].dx != image->comps[2].dx) ||
        (image->comps[0].dx != image->comps[3].dx)
        || (image->comps[0].dy != image->comps[1].dy) ||
        (image->comps[0].dy != image->comps[2].dy) ||
        (image->comps[0].dy != image->comps[3].dy)
    ) {
        fprintf(stderr, "%s:%d:color_cmyk_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }

    max = w * h;

    sC = 1.0F / (float)((1 << image->comps[0].prec) - 1);
    sM = 1.0F / (float)((1 << image->comps[1].prec) - 1);
    sY = 1.0F / (float)((1 << image->comps[2].prec) - 1);
    sK = 1.0F / (float)((1 << image->comps[3].prec) - 1);

    for (i = 0; i < max; ++i) {
        /* CMYK values from 0 to 1 */
        C = (float)(image->comps[0].data[i]) * sC;
        M = (float)(image->comps[1].data[i]) * sM;
        Y = (float)(image->comps[2].data[i]) * sY;
        K = (float)(image->comps[3].data[i]) * sK;

        /* Invert all CMYK values */
        C = 1.0F - C;
        M = 1.0F - M;
        Y = 1.0F - Y;
        K = 1.0F - K;

        /* CMYK -> RGB : RGB results from 0 to 255 */
        image->comps[0].data[i] = (int)(255.0F * C * K); /* R */
        image->comps[1].data[i] = (int)(255.0F * M * K); /* G */
        image->comps[2].data[i] = (int)(255.0F * Y * K); /* B */
    }

    opj_image_data_free(image->comps[3].data);
    image->comps[3].data = NULL;
    image->comps[0].prec = 8;
    image->comps[1].prec = 8;
    image->comps[2].prec = 8;
    image->numcomps -= 1;
    image->color_space = OPJ_CLRSPC_SRGB;

    for (i = 3; i < image->numcomps; ++i) {
        memcpy(&(image->comps[i]), &(image->comps[i + 1]), sizeof(image->comps[i]));
    }

}